

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierParser::addQualifier(CQualifierParser *this)

{
  bool bVar1;
  CQualifier CStack_58;
  
  CQualifier::CQualifier(&CStack_58);
  bVar1 = CModuleBuilder::GetNamedQualifier(&this->super_CModuleBuilder,&this->token,&CStack_58);
  if (bVar1) {
    CQualifierBuilder::AddQualifier(&this->builder,&CStack_58);
    this->afterRightParen = false;
  }
  else {
    if ((this->super_CParsingElementState).state != PES_NotFinished) {
      __assert_fail("!IsFinished()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/QualifierParser.h"
                    ,0x22,"void Refal2::CParsingElementState::SetFinished(bool)");
    }
    (this->super_CParsingElementState).state = PES_Wrong;
  }
  CStack_58.numbers.elementsSize = 0;
  if (CStack_58.numbers.elements != (uint *)0x0) {
    operator_delete__(CStack_58.numbers.elements);
  }
  CStack_58.numbers.elements = (uint *)0x0;
  CStack_58.labels.elementsSize = 0;
  if (CStack_58.labels.elements != (int *)0x0) {
    operator_delete__(CStack_58.labels.elements);
  }
  CStack_58.labels.elements = (int *)0x0;
  CStack_58.chars.elementsSize = 0;
  if (CStack_58.chars.elements != (char *)0x0) {
    operator_delete__(CStack_58.chars.elements);
  }
  return;
}

Assistant:

void CQualifierParser::addQualifier()
{
	CQualifier qualifier;
	if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
		builder.AddQualifier( qualifier );
		afterRightParen = false;
	} else {
		SetWrong();
	}
}